

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * get_fname(char *path,char *dest)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  char temp [260];
  char local_128 [272];
  
  __s = local_128;
  if (dest == (char *)0x0) {
    dest = (char *)0x0;
  }
  else {
    pcVar1 = point_basename(path);
    strcpy(local_128,pcVar1);
    pcVar1 = strchr(local_128,0x2e);
    while ((pcVar1 != (char *)0x0 && (sVar2 = strlen(__s), 1 < sVar2))) {
      if (*__s != '\0') {
        __s = __s + sVar2 + 1;
        do {
          pcVar1 = __s + -1;
          __s = __s + -1;
        } while (*pcVar1 != '.');
        *__s = '\0';
      }
      pcVar1 = strchr(local_128,0x2e);
    }
    memset(dest,0,0x104);
    strcpy(dest,local_128);
  }
  return dest;
}

Assistant:

char *get_fname(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	char *p = temp;
	strcpy(temp, point_basename(path));
	while (strchr(temp, '.') != NULL)
	{
		if (strlen(p) < 2)
		{
			break;
		}
		if (*p)
		{
			p += strlen(p);
			while (*p != '.')
			{
				--p;
			}
			if (!*p)
			{
				--p;
				break;
			}
			else
			{
				*p = '\0';
			}
		}
	}
	clear_path_string(dest, MAX_PATH);
	strcpy(dest, temp);
	return dest;
}